

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OstreamSupport.cpp
# Opt level: O1

ostream * operator<<(ostream *out,List<MiniScript::String> *rhs)

{
  ListStorage<MiniScript::String> *pLVar1;
  unsigned_long uVar2;
  String *rhs_00;
  long lVar3;
  int i;
  long lVar4;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_32,1);
  lVar3 = 0;
  lVar4 = 0;
  while( true ) {
    if (rhs->ls == (ListStorage<MiniScript::String> *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (rhs->ls->super_SimpleVector<MiniScript::String>).mQtyItems;
    }
    if ((long)uVar2 <= lVar4) break;
    if (lVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
    }
    if (rhs->ls == (ListStorage<MiniScript::String> *)0x0) {
      MiniScript::_Error("Assert failed: ls",
                         "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                         ,0x3c);
    }
    pLVar1 = rhs->ls;
    if (lVar4 < (long)(pLVar1->super_SimpleVector<MiniScript::String>).mQtyItems) {
      rhs_00 = (String *)
               ((long)&((pLVar1->super_SimpleVector<MiniScript::String>).mBuf)->ss + lVar3);
    }
    else {
      MiniScript::_Error("invalid index in SimpleVector::operator[]",
                         "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                         ,0xc1);
      rhs_00 = (pLVar1->super_SimpleVector<MiniScript::String>).mBuf;
    }
    operator<<(out,rhs_00);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x10;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_31,1);
  return out;
}

Assistant:

ostream & operator<< (ostream &out, const List<String> &rhs) {
	out << '[';
	for (int i=0; i<rhs.Count(); i++) {
		if (i > 0) out << ", ";
		out << rhs[i];
	}
	out << ']';
	return out;
}